

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O2

void __thiscall DSDcc::DSDDstar::~DSDDstar(DSDDstar *this)

{
  DStarHeader::~DStarHeader(&this->m_header);
  CRC::~CRC(&this->m_crc);
  DStarCRC::~DStarCRC(&this->m_crcDStar);
  Viterbi3::~Viterbi3(&this->m_viterbi);
  return;
}

Assistant:

DSDDstar::~DSDDstar()
{
}